

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageTest::iterate(StorageTest *this)

{
  GLuint width;
  GLuint height;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  long lVar5;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar6;
  GLint max_renderbuffer_size;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 *local_3c;
  undefined4 local_34;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(0x84e8);
    err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    glu::checkError(err,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1f5d);
    local_58 = &DAT_100000001;
    uStack_50 = 0x20000000100;
    local_48 = 0x2d000000500;
    local_40 = 0x4000;
    local_3c = &DAT_100000001;
    local_34 = 0x4000;
    bVar3 = 1;
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      width = *(GLuint *)(&local_58 + lVar5);
      height = *(GLuint *)((long)&local_58 + lVar5 * 8 + 4);
      for (lVar6 = 0; lVar6 != 0x408; lVar6 = lVar6 + 0x18) {
        bVar1 = PrepareRenderbuffer(this,*(RenderbufferInternalFormatConfiguration *)
                                          (s_renderbuffer_internalformat_configuration + lVar6),
                                    width,height);
        if (bVar1) {
          Clear(this,*(bool *)(lVar6 + 0x1dd71c6));
          bVar1 = Check(this,*(RenderbufferInternalFormatConfiguration *)
                              (s_renderbuffer_internalformat_configuration + lVar6),width,height);
          bVar3 = bVar1 & bVar3;
        }
        else {
          bVar3 = 0;
        }
        Clean(this);
      }
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		glw::GLint max_renderbuffer_size = 16384 /* Specification minimum. */;

		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &max_renderbuffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		const struct
		{
			glw::GLuint width;
			glw::GLuint height;
		} test_cases[] = { { 1, 1 },
						   { 256, 512 },
						   { 1280, 720 },
						   { (glw::GLuint)max_renderbuffer_size, 1 },
						   { 1, (glw::GLuint)max_renderbuffer_size } };

		const glw::GLuint test_cases_count = sizeof(test_cases) / sizeof(test_cases[0]);

		for (glw::GLuint i = 0; i < test_cases_count; ++i)
		{
			for (glw::GLuint j = 0; j < s_renderbuffer_internalformat_configuration_count; ++j)
			{
				if (PrepareRenderbuffer(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
										test_cases[i].height))
				{
					Clear(s_renderbuffer_internalformat_configuration[j].isColorIntegralFormat);
					is_ok &= Check(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
								   test_cases[i].height);
				}
				else
				{
					is_ok = false;
				}

				Clean();
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		Clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}